

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O2

bool __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::SaveType
          (KotlinKMPGenerator *this,string *defname,Namespace *ns,string *classcode,
          bool needs_includes)

{
  bool bVar1;
  char *__s;
  IdlNamer *this_00;
  string namespace_name;
  string dirs;
  string code;
  string qualified;
  string local_68;
  string filename;
  
  if (classcode->_M_string_length == 0) {
    bVar1 = true;
  }
  else {
    __s = BaseGenerator::FlatBuffersGeneratedWarning();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&namespace_name,__s,(allocator<char> *)&dirs);
    std::operator+(&qualified,"// ",&namespace_name);
    std::operator+(&code,&qualified,"\n\n");
    std::__cxx11::string::~string((string *)&qualified);
    std::__cxx11::string::~string((string *)&namespace_name);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&namespace_name,"",(allocator<char> *)&dirs);
    Namespace::GetFullyQualifiedName(&qualified,ns,&namespace_name,1000);
    std::__cxx11::string::~string((string *)&namespace_name);
    this_00 = &this->namer_;
    (*(this->namer_).super_Namer._vptr_Namer[10])(&namespace_name,this_00,ns);
    if (namespace_name._M_string_length != 0) {
      std::operator+(&dirs,"package ",&namespace_name);
      std::__cxx11::string::append((string *)&code);
      std::__cxx11::string::~string((string *)&dirs);
      std::__cxx11::string::append((char *)&code);
    }
    if (needs_includes) {
      std::__cxx11::string::append((char *)&code);
    }
    std::__cxx11::string::append((char *)&code);
    std::__cxx11::string::append((string *)&code);
    (*(this_00->super_Namer)._vptr_Namer[0xd])(&dirs,this_00,ns,0,0);
    EnsureDirExists(&dirs);
    Namer::File(&local_68,&this_00->super_Namer,defname,Suffix);
    std::operator+(&filename,&dirs,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    bVar1 = SaveFile(filename._M_dataplus._M_p,&code,false);
    std::__cxx11::string::~string((string *)&filename);
    std::__cxx11::string::~string((string *)&dirs);
    std::__cxx11::string::~string((string *)&namespace_name);
    std::__cxx11::string::~string((string *)&qualified);
    std::__cxx11::string::~string((string *)&code);
  }
  return bVar1;
}

Assistant:

bool SaveType(const std::string &defname, const Namespace &ns,
                const std::string &classcode, bool needs_includes) const {
    if (!classcode.length()) return true;

    std::string code =
        "// " + std::string(FlatBuffersGeneratedWarning()) + "\n\n";
    auto qualified = ns.GetFullyQualifiedName("");
    std::string namespace_name = namer_.Namespace(ns);
    if (!namespace_name.empty()) {
      code += "package " + namespace_name;
      code += "\n\n";
    }
    if (needs_includes) { code += "import com.google.flatbuffers.kotlin.*\n"; }
    code += "import kotlin.jvm.JvmInline\n";
    code += classcode;
    const std::string dirs =
        namer_.Directories(ns, SkipDir::None, Case::kUnknown);
    EnsureDirExists(dirs);
    const std::string filename =
        dirs + namer_.File(defname, /*skips=*/SkipFile::Suffix);
    return SaveFile(filename.c_str(), code, false);
  }